

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void housemat(double *v,int N,double beta,double *mat)

{
  double *C;
  double *temp;
  double *mat_local;
  double beta_local;
  int N_local;
  double *v_local;
  
  C = (double *)malloc((long)N * 8 * (long)N);
  eye(mat,N);
  mmult(v,v,C,N,1,N);
  scale(C,N,N,beta);
  msub(mat,C,mat,N,N);
  free(C);
  return;
}

Assistant:

void housemat(double *v, int N,double beta,double *mat) {
	double *temp;
	
	temp = (double*) malloc(sizeof(double) * N * N);
	eye(mat,N);
	mmult(v,v,temp,N,1,N);
	scale(temp,N,N,beta);
	msub(mat,temp,mat,N,N);
	
	free(temp);
}